

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Schema * sqlite3SchemaGet(sqlite3 *db,Btree *pBt)

{
  Schema *pSVar1;
  sqlite3 *in_RSI;
  undefined8 in_RDI;
  Schema *p;
  
  if (in_RSI == (sqlite3 *)0x0) {
    pSVar1 = (Schema *)sqlite3DbMallocZero((sqlite3 *)0x0,0xaaaaaaaaaaaaaaaa);
  }
  else {
    pSVar1 = (Schema *)
             sqlite3BtreeSchema((Btree *)p,(int)((ulong)in_RDI >> 0x20),
                                (_func_void_void_ptr *)in_RSI);
  }
  if (pSVar1 == (Schema *)0x0) {
    sqlite3OomFault(in_RSI);
  }
  else if (pSVar1->file_format == '\0') {
    sqlite3HashInit(&pSVar1->tblHash);
    sqlite3HashInit(&pSVar1->idxHash);
    sqlite3HashInit(&pSVar1->trigHash);
    sqlite3HashInit(&pSVar1->fkeyHash);
    pSVar1->enc = '\x01';
  }
  return pSVar1;
}

Assistant:

SQLITE_PRIVATE Schema *sqlite3SchemaGet(sqlite3 *db, Btree *pBt){
  Schema * p;
  if( pBt ){
    p = (Schema *)sqlite3BtreeSchema(pBt, sizeof(Schema), sqlite3SchemaClear);
  }else{
    p = (Schema *)sqlite3DbMallocZero(0, sizeof(Schema));
  }
  if( !p ){
    sqlite3OomFault(db);
  }else if ( 0==p->file_format ){
    sqlite3HashInit(&p->tblHash);
    sqlite3HashInit(&p->idxHash);
    sqlite3HashInit(&p->trigHash);
    sqlite3HashInit(&p->fkeyHash);
    p->enc = SQLITE_UTF8;
  }
  return p;
}